

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mei.c
# Opt level: O0

int mei_fwstatus(mei *me,uint32_t fwsts_num,uint32_t *fwsts)

{
  code *pcVar1;
  char *pcVar2;
  uint32_t *in_RDX;
  uint in_ESI;
  char *in_RDI;
  int rc;
  char *device;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  if ((in_RDI == (char *)0x0) || (in_RDX == (uint32_t *)0x0)) {
    uVar3 = 0xffffffea;
  }
  else if (in_ESI < 6) {
    if ((*(long *)(in_RDI + 0x30) == 0) ||
       (pcVar2 = strstr(*(char **)(in_RDI + 0x30),"/dev/"), pcVar2 != (char *)0x0)) {
      uVar3 = __mei_fwsts((mei *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,in_ESI,in_RDX);
      if ((int)uVar3 < 0) {
        if (*(int *)(in_RDI + 0x28) != 0) {
          if (*(long *)(in_RDI + 0x40) == 0) {
            pcVar2 = strerror(-uVar3);
            syslog(3,"me: error: Cannot get FW status [%d]:%s\n",(ulong)uVar3,pcVar2);
          }
          else {
            pcVar1 = *(code **)(in_RDI + 0x40);
            pcVar2 = strerror(-uVar3);
            (*pcVar1)(1,"me: error: Cannot get FW status [%d]:%s\n",uVar3,pcVar2);
          }
        }
      }
      else {
        uVar3 = 0;
      }
    }
    else {
      if (*(int *)(in_RDI + 0x28) != 0) {
        if (*(long *)(in_RDI + 0x40) == 0) {
          syslog(3,"me: error: Device does not start with \'%s\'\n","/dev/");
        }
        else {
          (**(code **)(in_RDI + 0x40))(1,"me: error: Device does not start with \'%s\'\n","/dev/");
        }
      }
      uVar3 = 0xffffffea;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x28) != 0) {
      if (*(long *)(in_RDI + 0x40) == 0) {
        syslog(3,"me: error: FW status number should be 0..5\n");
      }
      else {
        (**(code **)(in_RDI + 0x40))(1,"me: error: FW status number should be 0..5\n");
      }
    }
    uVar3 = 0xffffffea;
  }
  return uVar3;
}

Assistant:

int mei_fwstatus(struct mei *me, uint32_t fwsts_num, uint32_t *fwsts)
{
	char *device;
	int rc;

	if (!me || !fwsts)
		return -EINVAL;

	if (fwsts_num > MAX_FW_STATUS_NUM) {
		mei_err(me, "FW status number should be 0..5\n");
		return -EINVAL;
	}

	if (me->device) {
		device = strstr(me->device, MEI_DEFAULT_DEVICE_PREFIX);
		if (!device) {
			mei_err(me, "Device does not start with '%s'\n",
				MEI_DEFAULT_DEVICE_PREFIX);
			return -EINVAL;
		}
		device += strlen(MEI_DEFAULT_DEVICE_PREFIX);
	} else {
		device = MEI_DEFAULT_DEVICE_NAME;
	}
	rc = __mei_fwsts(me, device, fwsts_num, fwsts);
	if (rc < 0) {
		mei_err(me, "Cannot get FW status [%d]:%s\n",
			rc, strerror(-rc));
		return rc;
	}

	return 0;
}